

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O2

int Ptr_ManCountNtk(Vec_Ptr_t *vNtk)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  Vec_Ptr_t *p;
  int iVar4;
  int i;
  
  pvVar1 = Vec_PtrEntry(vNtk,1);
  pvVar2 = Vec_PtrEntry(vNtk,2);
  pvVar3 = Vec_PtrEntry(vNtk,3);
  p = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,4);
  if (*(int *)((long)pvVar3 + 4) == 0) {
    iVar4 = *(int *)((long)pvVar2 + 4) + *(int *)((long)pvVar1 + 4);
    for (i = 0; i < p->nSize; i = i + 1) {
      pvVar1 = Vec_PtrEntry(p,i);
      iVar4 = iVar4 + *(int *)((long)pvVar1 + 4) / 2;
    }
    return iVar4;
  }
  __assert_fail("Vec_PtrSize(vNodes) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPtrAbc.c"
                ,0x106,"int Ptr_ManCountNtk(Vec_Ptr_t *)");
}

Assistant:

int Ptr_ManCountNtk( Vec_Ptr_t * vNtk )
{
    Vec_Ptr_t * vInputs = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1);
    Vec_Ptr_t * vOutputs = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2);
    Vec_Ptr_t * vNodes = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 3);
    Vec_Ptr_t * vBoxes = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 4);
    Vec_Ptr_t * vBox; int i, Counter = 0;
    assert( Vec_PtrSize(vNodes) == 0 );
    Counter += Vec_PtrSize(vInputs);
    Counter += Vec_PtrSize(vOutputs);
    Vec_PtrForEachEntry( Vec_Ptr_t *, vBoxes, vBox, i )
        Counter += Vec_PtrSize(vBox)/2;
    return Counter;
}